

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_fits.c
# Opt level: O2

char * sfts_timestamp(char *ts)

{
  size_t sVar1;
  
  if (ts != (char *)0x0) {
    sVar1 = strlen(ts);
    if ((sVar1 != 0) && (ts[sVar1 - 1] == 'Z')) {
      ts[sVar1 - 1] = '\0';
    }
  }
  return ts;
}

Assistant:

char *sfts_timestamp(char *ts) {
    size_t l;

    if (!ts)
        return ts;
    if ((l = strlen(ts)) && ts[l - 1] == 'Z')
        ts[l - 1] = 0;
    return ts;
}